

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::DescriptorProto_ReservedRange::_InternalParse
          (DescriptorProto_ReservedRange *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  uint32 uVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  pair<const_char_*,_bool> pVar11;
  
  uVar6 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar11._8_8_ = 0;
      pVar11.first = ptr;
    }
    else {
      pVar11._8_8_ = 1;
      pVar11.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar11 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar11.first;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_002e5cf2;
    bVar1 = *ptr;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar8 = internal::ReadTagFallback(ptr,uVar7);
      }
      else {
        pVar8.second = uVar7;
        pVar8.first = (char *)((byte *)ptr + 2);
        pVar8._12_4_ = 0;
      }
    }
    else {
      pVar8.second._0_1_ = bVar1;
      pVar8.first = (char *)((byte *)ptr + 1);
      pVar8._9_7_ = 0;
    }
    ptr = pVar8.first;
    if ((byte *)ptr == (byte *)0x0) {
      cVar5 = '\x04';
    }
    else {
      uVar7 = pVar8.second;
      uVar4 = (uint)(pVar8._8_8_ >> 3) & 0x1fffffff;
      if (uVar4 == 2) {
        if ((char)pVar8.second != '\x10') goto LAB_002e5c35;
        bVar1 = *ptr;
        pVar10.second = (long)(char)bVar1;
        pVar10.first = ptr;
        pbVar3 = (byte *)ptr + 1;
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar7 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar10 = internal::VarintParseSlow64(ptr,uVar7);
          }
          else {
            pVar10.second._0_4_ = uVar7;
            pVar10.first = (char *)((byte *)ptr + 2);
            pVar10.second._4_4_ = 0;
          }
          pbVar3 = (byte *)pVar10.first;
        }
        ptr = (char *)pbVar3;
        uVar6 = uVar6 | 2;
        this->end_ = (int32)pVar10.second;
      }
      else {
        if ((uVar4 != 1) || ((char)pVar8.second != '\b')) {
LAB_002e5c35:
          if (uVar7 == 0 || (uVar7 & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
            cVar5 = '\a';
          }
          else {
            ptr = internal::UnknownFieldParse(uVar7,&this->_internal_metadata_,ptr,ctx);
            cVar5 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
          }
          goto LAB_002e5caf;
        }
        bVar1 = *ptr;
        pVar9.second = (long)(char)bVar1;
        pVar9.first = ptr;
        pbVar3 = (byte *)ptr + 1;
        if ((long)(char)bVar1 < 0) {
          uVar7 = ((uint)*pbVar3 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*pbVar3 < '\0') {
            pVar9 = internal::VarintParseSlow64(ptr,uVar7);
          }
          else {
            pVar9.second._0_4_ = uVar7;
            pVar9.first = (char *)((byte *)ptr + 2);
            pVar9.second._4_4_ = 0;
          }
          pbVar3 = (byte *)pVar9.first;
        }
        uVar6 = uVar6 | 1;
        this->start_ = (int32)pVar9.second;
        ptr = (char *)pbVar3;
      }
      cVar5 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_002e5caf:
  } while (cVar5 == '\x02');
  if (cVar5 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_002e5cf2:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar6;
  return ptr;
}

Assistant:

const char* DescriptorProto_ReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}